

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix4f.cpp
# Opt level: O0

Matrix4f *
Matrix4f::perspectiveProjection
          (Matrix4f *__return_storage_ptr__,float fLeft,float fRight,float fBottom,float fTop,
          float fZNear,float fZFar,bool directX)

{
  float *pfVar1;
  bool directX_local;
  float fZFar_local;
  float fZNear_local;
  float fTop_local;
  float fBottom_local;
  float fRight_local;
  float fLeft_local;
  Matrix4f *projection;
  
  Matrix4f(__return_storage_ptr__,0.0);
  pfVar1 = operator()(__return_storage_ptr__,0,0);
  *pfVar1 = (fZNear * 2.0) / (fRight - fLeft);
  pfVar1 = operator()(__return_storage_ptr__,1,1);
  *pfVar1 = (fZNear * 2.0) / (fTop - fBottom);
  pfVar1 = operator()(__return_storage_ptr__,0,2);
  *pfVar1 = (fRight + fLeft) / (fRight - fLeft);
  pfVar1 = operator()(__return_storage_ptr__,1,2);
  *pfVar1 = (fTop + fBottom) / (fTop - fBottom);
  pfVar1 = operator()(__return_storage_ptr__,3,2);
  *pfVar1 = -1.0;
  if (directX) {
    pfVar1 = operator()(__return_storage_ptr__,2,2);
    *pfVar1 = fZFar / (fZNear - fZFar);
    pfVar1 = operator()(__return_storage_ptr__,2,3);
    *pfVar1 = (fZNear * fZFar) / (fZNear - fZFar);
  }
  else {
    pfVar1 = operator()(__return_storage_ptr__,2,2);
    *pfVar1 = (fZNear + fZFar) / (fZNear - fZFar);
    pfVar1 = operator()(__return_storage_ptr__,2,3);
    *pfVar1 = (fZNear * 2.0 * fZFar) / (fZNear - fZFar);
  }
  return __return_storage_ptr__;
}

Assistant:

Matrix4f Matrix4f::perspectiveProjection( float fLeft, float fRight,
										 float fBottom, float fTop,
										 float fZNear, float fZFar,
										 bool directX )
{
	Matrix4f projection; // zero matrix

	projection( 0, 0 ) = ( 2.0f * fZNear ) / ( fRight - fLeft );
	projection( 1, 1 ) = ( 2.0f * fZNear ) / ( fTop - fBottom );
	projection( 0, 2 ) = ( fRight + fLeft ) / ( fRight - fLeft );
	projection( 1, 2 ) = ( fTop + fBottom ) / ( fTop - fBottom );
	projection( 3, 2 ) = -1;

	if( directX )
	{
		projection( 2, 2 ) = fZFar / ( fZNear - fZFar);
		projection( 2, 3 ) = ( fZNear * fZFar ) / ( fZNear - fZFar );
	}
	else
	{
		projection( 2, 2 ) = ( fZNear + fZFar ) / ( fZNear - fZFar );
		projection( 2, 3 ) = ( 2.0f * fZNear * fZFar ) / ( fZNear - fZFar );
	}

	return projection;
}